

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O1

void __thiscall
ktx::OptionsSingleIn::process
          (OptionsSingleIn *this,Options *param_1,ParseResult *args,Reporter *report)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t sVar3;
  size_t sVar4;
  OptionValue *this_00;
  string local_78;
  string local_58;
  string *local_38;
  
  local_38 = (string *)this;
  if ((args->m_unmatched).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (args->m_unmatched).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Reporter::fatal_usage<char_const(&)[30]>(report,(char (*) [30])"Too many filenames specified.");
  }
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"stdin","");
  sVar3 = cxxopts::ParseResult::count(args,&local_78);
  paVar2 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"input-file","");
  sVar4 = cxxopts::ParseResult::count(args,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 == -sVar4) {
    Reporter::fatal_usage<char_const(&)[70]>
              (report,(char (*) [70])
                      "Missing input file. Either <input-file> or --stdin must be specified.");
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"stdin","");
  sVar3 = cxxopts::ParseResult::count(args,&local_78);
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"input-file","");
  sVar4 = cxxopts::ParseResult::count(args,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (1 < sVar4 + sVar3) {
    Reporter::fatal_usage<char_const(&)[78]>
              (report,(char (*) [78])
                      "Conflicting options: Only one can be specified from <input-file> and --stdin."
              );
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"stdin","");
  sVar3 = cxxopts::ParseResult::count(args,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (sVar3 == 0) {
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"input-file","");
    this_00 = cxxopts::ParseResult::operator[](args,&local_78);
    cxxopts::OptionValue::as<std::__cxx11::string>(this_00);
    std::__cxx11::string::_M_assign(local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_replace((ulong)local_38,0,*(char **)(local_38 + 8),0x200d34);
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        if (!args.unmatched().empty())
            report.fatal_usage("Too many filenames specified.");

        if (args.count("stdin") + args.count("input-file") == 0)
            report.fatal_usage("Missing input file. Either <input-file> or --stdin must be specified.");
        if (args.count("stdin") + args.count("input-file") > 1)
            report.fatal_usage("Conflicting options: Only one can be specified from <input-file> and --stdin.");

        if (args.count("stdin"))
            inputFilepath = "-";
        else
            inputFilepath = args["input-file"].as<std::string>();
    }